

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O3

void __thiscall JsonString_FourFs_Test::TestBody(JsonString_FourFs_Test *this)

{
  TypedExpectation<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_00;
  parser<callbacks_proxy<mock_json_callbacks>_> *this_01;
  pointer *__ptr;
  char *message;
  char *in_R9;
  coord local_f8;
  coord local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  AssertHelper local_e0;
  undefined1 local_d8 [8];
  VTable *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  undefined1 local_b8 [8];
  deque<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>_>_>
  local_b0;
  int local_60;
  _Alloc_hider local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  coord local_20;
  
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           *)local_d8,anon_var_dwarf_25ed17);
  mock_json_callbacks::gmock_string_value
            ((MockSpec<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)local_b8,&(this->super_JsonString).callbacks_.super_mock_json_callbacks,
             (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)local_d8);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::InternalExpectedAt
                      ((MockSpec<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)local_b8,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_string.cpp"
                       ,0x80,"callbacks_","string_value (\"\\xEF\\xBF\\xBF\")");
  testing::internal::
  TypedExpectation<std::error_code_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::Times(this_00,1);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)&local_b0);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)local_d8);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::parser
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_b8,
             (this->super_JsonString).proxy_.original_,none);
  this_01 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::input
                      ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_b8,"\"\\uFFFF\"");
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::eof(this_01);
  local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60 != 0) {
    local_f0.column._0_1_ = local_60 == 0;
    testing::Message::Message((Message *)&local_f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_f8 + 0x10),"Expected the parse to succeed",0x1d);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_d8,(internal *)&local_f0,(AssertionResult *)"p.has_error ()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_string.cpp"
               ,0x84,(char *)CONCAT71(local_d8._1_7_,local_d8[0]));
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_d8._1_7_,local_d8[0]) != &local_c8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_d8._1_7_,local_d8[0]),local_c8._M_allocated_capacity + 1);
    }
    if (local_f8 != (coord)0x0) {
      (**(code **)(*(long *)local_f8 + 8))();
    }
    if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_e8,local_e8);
    }
  }
  local_f0.column._0_1_ = local_60 == 0;
  local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60 != 0) {
    testing::Message::Message((Message *)&local_f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_f8 + 0x10),"Expected the parse error to be zero",0x23);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_d8,(internal *)&local_f0,(AssertionResult *)"p.last_error ()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_string.cpp"
               ,0x85,(char *)CONCAT71(local_d8._1_7_,local_d8[0]));
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_d8._1_7_,local_d8[0]) != &local_c8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_d8._1_7_,local_d8[0]),local_c8._M_allocated_capacity + 1);
    }
    if (local_f8 != (coord)0x0) {
      (**(code **)(*(long *)local_f8 + 8))();
    }
    if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_e8,local_e8);
    }
  }
  local_f0 = local_20;
  local_f8.column = 9;
  local_f8.row = 1;
  testing::internal::CmpHelperEQ<pstore::json::coord,pstore::json::coord>
            ((internal *)local_d8,"p.coordinate ()","(json::coord{9U, 1U})",&local_f0,&local_f8);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if (local_d0 == (VTable *)0x0) {
      message = "";
    }
    else {
      message = ((_Alloc_hider *)&local_d0->match_and_explain)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_string.cpp"
               ,0x86,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    if (local_f0 != (coord)0x0) {
      (**(code **)(*(long *)local_f0 + 8))();
    }
  }
  if (local_d0 != (VTable *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_p != &local_30) {
    operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>_>_>
  ::~deque(&local_b0);
  if ((_Head_base<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_false>
       )local_b8 !=
      (_Head_base<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_false>
       )0x0) {
    operator_delete((void *)local_b8,0x68);
  }
  return;
}

Assistant:

TEST_F (JsonString, FourFs) {
    // Note that there is no unicode code-point at U+FFFF.
    EXPECT_CALL (callbacks_, string_value ("\xEF\xBF\xBF")).Times (1);

    auto p = json::make_parser (proxy_);
    p.input ("\"\\uFFFF\"").eof ();
    EXPECT_FALSE (p.has_error ()) << "Expected the parse to succeed";
    EXPECT_FALSE (p.last_error ()) << "Expected the parse error to be zero";
    EXPECT_EQ (p.coordinate (), (json::coord{9U, 1U}));
}